

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t_00;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  int iVar5;
  size_type sVar6;
  const_reference pvVar7;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  cmTarget *pcVar8;
  ostream *poVar9;
  string *psVar10;
  ulong uVar11;
  char *pcVar12;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  allocator local_8f1;
  string local_8f0;
  byte local_8cb;
  byte local_8ca;
  allocator local_8c9;
  string local_8c8;
  PolicyStatus local_8a4;
  undefined1 local_8a0 [4];
  PolicyStatus policy22Status;
  ostringstream local_880 [8];
  ostringstream e_3;
  char *linkTypeString;
  string linkType;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  allocator local_661;
  string local_660;
  allocator local_639;
  string local_638;
  allocator local_611;
  string local_610;
  uint local_5f0;
  byte local_5e9;
  uint i;
  uint uStack_5e4;
  bool haveLLT;
  cmTargetLinkLibraryType llt;
  string local_5c0;
  MessageType local_59c;
  char *pcStack_598;
  MessageType messageType;
  char *modal;
  ostringstream e_2;
  string local_418;
  ostringstream local_3f8 [8];
  ostringstream e_1;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  ostringstream e;
  int local_88;
  allocator local_81;
  MessageType t;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004f861b;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  bVar2 = cmMakefile::IsAlias(pcVar1,pvVar7);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&t,"can not be used on an ALIAS target.",&local_81);
    cmCommand::SetError(&this->super_cmCommand,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    this_local._7_1_ = 0;
    goto LAB_004f861b;
  }
  this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  this_01 = cmake::GetGlobalGenerator(this_00);
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  pcVar8 = cmGlobalGenerator::FindTarget(this_01,pvVar7,false);
  this->Target = pcVar8;
  if (this->Target == (cmTarget *)0x0) {
    local_88 = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar9 = std::operator<<((ostream *)local_200,"Cannot specify link libraries for target \"");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    poVar9 = std::operator<<(poVar9,(string *)pvVar7);
    poVar9 = std::operator<<(poVar9,"\" ");
    std::operator<<(poVar9,"which is not built by this project.");
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar6 < 2) {
      PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016);
      switch(PVar3) {
      case OLD:
        local_88 = 4;
        break;
      case WARN:
        local_88 = 0;
        poVar9 = std::operator<<((ostream *)local_200,"\n");
        poVar9 = std::operator<<(poVar9,
                                 "CMake does not support this but it used to work accidentally ");
        poVar9 = std::operator<<(poVar9,"and is being allowed for compatibility.");
        poVar9 = std::operator<<(poVar9,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)0x10,id);
        std::operator<<(poVar9,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        break;
      case NEW:
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        poVar9 = std::operator<<((ostream *)local_200,"\n");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_240,(cmPolicies *)0x10,id_00);
        std::operator<<(poVar9,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
      }
    }
    if (local_88 == 0) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_260,false);
      std::__cxx11::string::~string((string *)&local_260);
    }
    else if (local_88 == 2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_280,false);
      std::__cxx11::string::~string((string *)&local_280);
      cmSystemTools::SetFatalErrorOccured();
    }
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    goto LAB_004f861b;
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == OBJECT_LIBRARY) {
    std::__cxx11::ostringstream::ostringstream(local_3f8);
    poVar9 = std::operator<<((ostream *)local_3f8,"Object library target \"");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    poVar9 = std::operator<<(poVar9,(string *)pvVar7);
    poVar9 = std::operator<<(poVar9,"\" ");
    std::operator<<(poVar9,"may not link to anything.");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_418,false);
    std::__cxx11::string::~string((string *)&local_418);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_3f8);
    goto LAB_004f861b;
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_598 = (char *)0x0;
    local_59c = AUTHOR_WARNING;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_5c0,(cmPolicies *)0x27,id_01);
        poVar9 = std::operator<<((ostream *)&modal,(string *)&local_5c0);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&local_5c0);
        pcStack_598 = "should";
      }
      else if (PVar3 - NEW < 3) {
        pcStack_598 = "must";
        local_59c = FATAL_ERROR;
      }
    }
    if (pcStack_598 == (char *)0x0) {
LAB_004f789a:
      uStack_5e4 = 0;
    }
    else {
      poVar9 = std::operator<<((ostream *)&modal,"Utility target \"");
      psVar10 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      poVar9 = std::operator<<(poVar9,"\" ");
      poVar9 = std::operator<<(poVar9,pcStack_598);
      std::operator<<(poVar9," not be used as the target of a target_link_libraries call.");
      t_00 = local_59c;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t_00,(string *)&llt,false);
      std::__cxx11::string::~string((string *)&llt);
      if (local_59c != FATAL_ERROR) goto LAB_004f789a;
      this_local._7_1_ = 0;
      uStack_5e4 = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (uStack_5e4 != 0) goto LAB_004f861b;
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (sVar6 < 2) {
    this_local._7_1_ = 1;
  }
  else {
    i = 0;
    local_5e9 = 0;
    this->CurrentProcessingState = ProcessingLinkLibraries;
    for (local_5f0 = 1; uVar11 = (ulong)local_5f0,
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local), uVar11 < sVar6; local_5f0 = local_5f0 + 1) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(ulong)local_5f0);
      bVar2 = std::operator==(pvVar7,"LINK_INTERFACE_LIBRARIES");
      if (bVar2) {
        this->CurrentProcessingState = ProcessingPlainLinkInterface;
        if (local_5f0 != 1) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_610,
                     "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                     ,&local_611);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_610,false);
          std::__cxx11::string::~string((string *)&local_610);
          std::allocator<char>::~allocator((allocator<char> *)&local_611);
          this_local._7_1_ = 1;
          goto LAB_004f861b;
        }
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_5f0);
        bVar2 = std::operator==(pvVar7,"INTERFACE");
        if (bVar2) {
          if (((local_5f0 != 1) &&
              (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
             ((this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
              (this->CurrentProcessingState != ProcessingKeywordLinkInterface)))) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_638,
                       "The INTERFACE option must appear as the second argument, just after the target name."
                       ,&local_639);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_638,false);
            std::__cxx11::string::~string((string *)&local_638);
            std::allocator<char>::~allocator((allocator<char> *)&local_639);
            this_local._7_1_ = 1;
            goto LAB_004f861b;
          }
          this->CurrentProcessingState = ProcessingKeywordLinkInterface;
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_5f0);
          bVar2 = std::operator==(pvVar7,"LINK_PUBLIC");
          if (bVar2) {
            if (((local_5f0 != 1) &&
                (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) &&
               (this->CurrentProcessingState != ProcessingPlainPublicInterface)) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_660,
                         "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                         ,&local_661);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_660,false);
              std::__cxx11::string::~string((string *)&local_660);
              std::allocator<char>::~allocator((allocator<char> *)&local_661);
              this_local._7_1_ = 1;
              goto LAB_004f861b;
            }
            this->CurrentProcessingState = ProcessingPlainPublicInterface;
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_5f0);
            bVar2 = std::operator==(pvVar7,"PUBLIC");
            if (bVar2) {
              if ((((local_5f0 != 1) &&
                   (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
                  (this->CurrentProcessingState != ProcessingKeywordPublicInterface)) &&
                 (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_688,
                           "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                           ,&local_689);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_688,false);
                std::__cxx11::string::~string((string *)&local_688);
                std::allocator<char>::~allocator((allocator<char> *)&local_689);
                this_local._7_1_ = 1;
                goto LAB_004f861b;
              }
              this->CurrentProcessingState = ProcessingKeywordPublicInterface;
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)local_5f0);
              bVar2 = std::operator==(pvVar7,"LINK_PRIVATE");
              if (bVar2) {
                if (((local_5f0 != 1) &&
                    (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
                   (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_6b0,
                             "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                             ,&local_6b1);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_6b0,false);
                  std::__cxx11::string::~string((string *)&local_6b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
                  this_local._7_1_ = 1;
                  goto LAB_004f861b;
                }
                this->CurrentProcessingState = ProcessingPlainPrivateInterface;
              }
              else {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)local_5f0);
                bVar2 = std::operator==(pvVar7,"PRIVATE");
                if (bVar2) {
                  if (((local_5f0 != 1) &&
                      (this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
                     ((this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
                      (this->CurrentProcessingState != ProcessingKeywordLinkInterface)))) {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_6d8,
                               "The PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                               ,(allocator *)(linkType.field_2._M_local_buf + 0xf));
                    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_6d8,false);
                    std::__cxx11::string::~string((string *)&local_6d8);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(linkType.field_2._M_local_buf + 0xf));
                    this_local._7_1_ = 1;
                    goto LAB_004f861b;
                  }
                  this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
                }
                else {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local,(ulong)local_5f0);
                  bVar2 = std::operator==(pvVar7,"debug");
                  if (bVar2) {
                    if ((local_5e9 & 1) != 0) {
                      LinkLibraryTypeSpecifierWarning(this,i,1);
                    }
                    i = 1;
                    local_5e9 = 1;
                  }
                  else {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local,(ulong)local_5f0);
                    bVar2 = std::operator==(pvVar7,"optimized");
                    if (bVar2) {
                      if ((local_5e9 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(this,i,2);
                      }
                      i = 2;
                      local_5e9 = 1;
                    }
                    else {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)param_2_local,(ulong)local_5f0);
                      bVar2 = std::operator==(pvVar7,"general");
                      if (bVar2) {
                        if ((local_5e9 & 1) != 0) {
                          LinkLibraryTypeSpecifierWarning(this,i,0);
                        }
                        i = 0;
                        local_5e9 = 1;
                      }
                      else if ((local_5e9 & 1) == 0) {
                        i = 0;
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,0);
                        std::__cxx11::string::string((string *)&linkTypeString,(string *)pvVar7);
                        std::__cxx11::string::operator+=((string *)&linkTypeString,"_LINK_TYPE");
                        pcVar12 = cmMakefile::GetDefinition
                                            ((this->super_cmCommand).Makefile,
                                             (string *)&linkTypeString);
                        if (pcVar12 != (char *)0x0) {
                          iVar5 = strcmp(pcVar12,"debug");
                          if (iVar5 == 0) {
                            i = 1;
                          }
                          iVar5 = strcmp(pcVar12,"optimized");
                          if (iVar5 == 0) {
                            i = 2;
                          }
                        }
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_5f0);
                        bVar2 = HandleLibrary(this,pvVar7,i);
                        if (!bVar2) {
                          this_local._7_1_ = 0;
                        }
                        uStack_5e4 = (uint)!bVar2;
                        std::__cxx11::string::~string((string *)&linkTypeString);
                        if (uStack_5e4 != 0) goto LAB_004f861b;
                      }
                      else {
                        local_5e9 = 0;
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)param_2_local,(ulong)local_5f0);
                        bVar2 = HandleLibrary(this,pvVar7,i);
                        if (!bVar2) {
                          this_local._7_1_ = 0;
                          goto LAB_004f861b;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_5e9 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_880);
      poVar9 = std::operator<<((ostream *)local_880,"The \"");
      poVar9 = std::operator<<(poVar9,LinkLibraryTypeNames[i]);
      std::operator<<(poVar9,"\" argument must be followed by a library.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_8a0,false);
      std::__cxx11::string::~string((string *)local_8a0);
      cmSystemTools::SetFatalErrorOccured();
      std::__cxx11::ostringstream::~ostringstream(local_880);
    }
    local_8a4 = cmTarget::GetPolicyStatusCMP0022(this->Target);
    local_8ca = 0;
    local_8cb = 0;
    if (((local_8a4 == OLD) || (bVar2 = false, local_8a4 == WARN)) &&
       (bVar2 = false, this->CurrentProcessingState != ProcessingLinkLibraries)) {
      pcVar8 = this->Target;
      std::allocator<char>::allocator();
      local_8ca = 1;
      std::__cxx11::string::string((string *)&local_8c8,"LINK_INTERFACE_LIBRARIES",&local_8c9);
      local_8cb = 1;
      pcVar12 = cmTarget::GetProperty(pcVar8,&local_8c8);
      bVar2 = pcVar12 == (char *)0x0;
    }
    if ((local_8cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_8c8);
    }
    if ((local_8ca & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    }
    if (bVar2) {
      pcVar8 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8f0,"LINK_INTERFACE_LIBRARIES",&local_8f1);
      cmTarget::SetProperty(pcVar8,&local_8f0,"");
      std::__cxx11::string::~string((string *)&local_8f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    }
    this_local._7_1_ = 1;
  }
LAB_004f861b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetLinkLibrariesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // must have one argument
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  if (this->Makefile->IsAlias(args[0]))
    {
    this->SetError("can not be used on an ALIAS target.");
    return false;
    }
  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()
    ->GetGlobalGenerator()->FindTarget(args[0]);
  if(!this->Target)
    {
    cmake::MessageType t = cmake::FATAL_ERROR;  // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2)
      {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016))
        {
        case cmPolicies::WARN:
          t = cmake::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
           break;
        case cmPolicies::OLD:          // OLD behavior does not warn.
          t = cmake::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW:  // NEW behavior prints the error.
          break;
        }
      }

    // now actually print the message
    switch(t)
      {
      case cmake::AUTHOR_WARNING:
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        break;
      case cmake::FATAL_ERROR:
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
      }
    return true;
    }

  if(this->Target->GetType() == cmState::OBJECT_LIBRARY)
    {
    std::ostringstream e;
    e << "Object library target \"" << args[0] << "\" "
      << "may not link to anything.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  if (this->Target->GetType() == cmState::UTILITY)
    {
    std::ostringstream e;
    const char *modal = 0;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0039))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e <<
        "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if(messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // but we might not have any libs after variable expansion
  if(args.size() < 2)
    {
    return true;
    }

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // add libraries, note that there is an optional prefix
  // of debug and optimized that can be used
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "LINK_INTERFACE_LIBRARIES")
      {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if(i != 1)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      }
    else if(args[i] == "INTERFACE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The INTERFACE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
      }
    else if(args[i] == "LINK_PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface
          && this->CurrentProcessingState != ProcessingPlainPublicInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
      }
    else if(args[i] == "PUBLIC")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
      }
    else if(args[i] == "LINK_PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingPlainPublicInterface
          && this->CurrentProcessingState != ProcessingPlainPrivateInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
      }
    else if(args[i] == "PRIVATE")
      {
      if(i != 1
          && this->CurrentProcessingState != ProcessingKeywordPrivateInterface
          && this->CurrentProcessingState != ProcessingKeywordPublicInterface
          && this->CurrentProcessingState != ProcessingKeywordLinkInterface)
        {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name."
          );
        return true;
        }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
      }
    else if(args[i] == "debug")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, DEBUG_LibraryType);
        }
      llt = DEBUG_LibraryType;
      haveLLT = true;
      }
    else if(args[i] == "optimized")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, OPTIMIZED_LibraryType);
        }
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
      }
    else if(args[i] == "general")
      {
      if(haveLLT)
        {
        this->LinkLibraryTypeSpecifierWarning(llt, GENERAL_LibraryType);
        }
      llt = GENERAL_LibraryType;
      haveLLT = true;
      }
    else if(haveLLT)
      {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    else
      {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there maybe the case where someone has
      // specifed that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = GENERAL_LibraryType;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString =
        this->Makefile->GetDefinition( linkType );
      if(linkTypeString)
        {
        if(strcmp(linkTypeString, "debug") == 0)
          {
          llt = DEBUG_LibraryType;
          }
        if(strcmp(linkTypeString, "optimized") == 0)
          {
          llt = OPTIMIZED_LibraryType;
          }
        }
      if (!this->HandleLibrary(args[i], llt))
        {
        return false;
        }
      }
    }

  // Make sure the last argument was not a library type specifier.
  if(haveLLT)
    {
    std::ostringstream e;
    e << "The \"" << this->LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    }

  const cmPolicies::PolicyStatus policy22Status
                      = this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if((policy22Status == cmPolicies::OLD ||
      policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
     !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES"))
    {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
    }

  return true;
}